

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCDOrderParameter.cpp
# Opt level: O0

void __thiscall
OpenMD::SCDOrderParameter::SCDOrderParameter
          (SCDOrderParameter *this,SimInfo *info,string *filename,string *molname,int beginIndex,
          int endIndex)

{
  vector<double,_std::allocator<double>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  string sele3;
  string sele2;
  string sele1;
  string selectionTemplate;
  int i;
  string *in_stack_00001150;
  string *in_stack_00001158;
  string *in_stack_00001160;
  SimInfo *in_stack_00001168;
  SCDElem *in_stack_00001170;
  undefined4 in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdbc;
  StaticAnalyser *in_stack_fffffffffffffdc0;
  pointer *ppdVar1;
  SimInfo *in_stack_fffffffffffffdc8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  int local_78;
  string local_68 [32];
  string local_48 [32];
  int local_28;
  int local_24;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)in_stack_fffffffffffffdd0._M_current,in_stack_fffffffffffffdc8,
             (string *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__SCDOrderParameter_00560198;
  ppdVar1 = &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>::vector
            ((vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_> *)0x1b6f5e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1b6f74);
  getPrefix((string *)in_stack_fffffffffffffdc8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffdc0,
             (string *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  for (local_78 = local_24; local_78 <= local_28 + -2; local_78 = local_78 + 1) {
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    std::__cxx11::string::~string(local_b8);
    OpenMD_itoa_abi_cxx11_(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc0);
    std::__cxx11::string::~string(local_f8);
    OpenMD_itoa_abi_cxx11_(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc0);
    std::__cxx11::string::~string(local_138);
    OpenMD_itoa_abi_cxx11_(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc0);
    std::__cxx11::string::~string(local_178);
    in_stack_fffffffffffffdd0._M_current =
         (double *)
         &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish;
    SCDElem::SCDElem(in_stack_00001170,in_stack_00001168,in_stack_00001160,in_stack_00001158,
                     in_stack_00001150);
    std::vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>::push_back
              ((vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_> *)
               in_stack_fffffffffffffdc0,
               (value_type *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    SCDElem::~SCDElem((SCDElem *)in_stack_fffffffffffffdc0);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_98);
  }
  __last._M_current =
       (double *)
       &in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>::size
            ((vector<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_> *)
             &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::resize(in_RDI,(size_type)ppdVar1);
  ppdVar1 = &in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_fffffffffffffdd0,__last,(double *)ppdVar1);
  return;
}

Assistant:

SCDOrderParameter::SCDOrderParameter(SimInfo* info,
                                       const std::string& filename,
                                       const std::string& molname,
                                       int beginIndex, int endIndex) :
      StaticAnalyser(info, filename, 1) {
    setOutputName(getPrefix(filename) + ".scd");

    assert(beginIndex >= 0 && endIndex >= 0 && beginIndex <= endIndex - 2);
    for (int i = beginIndex; i <= endIndex - 2; ++i) {
      std::string selectionTemplate = "select " + molname + ".";
      std::string sele1             = selectionTemplate + OpenMD_itoa(i);
      std::string sele2             = selectionTemplate + OpenMD_itoa(i + 1);
      std::string sele3             = selectionTemplate + OpenMD_itoa(i + 2);

      scdElems_.push_back(SCDElem(info, sele1, sele2, sele3));
    }

    scdParam_.resize(scdElems_.size());
    std::fill(scdParam_.begin(), scdParam_.end(), 0.0);
  }